

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_string.c
# Opt level: O0

ssize_t mpt_encode_string(mpt_encode_state *info,iovec *to,iovec *from)

{
  ulong __n;
  char *pcVar1;
  void *pvVar2;
  long lVar3;
  long local_b0;
  ssize_t k;
  ssize_t j;
  uint8_t *c2;
  uint8_t *v2;
  ssize_t total;
  ssize_t i;
  uint8_t *val;
  uint8_t *cmp;
  ssize_t pos;
  iovec tmp;
  size_t max;
  size_t off;
  size_t len;
  size_t sep;
  uint8_t *base;
  iovec *from_local;
  iovec *to_local;
  mpt_encode_state *info_local;
  
  if (to == (iovec *)0x0) {
    info->_ctx = 0;
    info->done = 0;
    info->scratch = 0;
    info_local = (mpt_encode_state *)0x0;
  }
  else {
    __n = info->scratch;
    max = info->done + info->scratch;
    pvVar2 = to->iov_base;
    tmp.iov_len = to->iov_len;
    if (tmp.iov_len < max) {
      info_local = (mpt_encode_state *)0xffffffffffffffff;
    }
    else if (from == (iovec *)0x0) {
      tmp.iov_len = tmp.iov_len - max;
      if (__n == 0) {
        if (tmp.iov_len == 0) {
          return -0x11;
        }
        *(char *)((long)pvVar2 + max) = (char)info->_ctx;
        max = max + 1;
      }
      else {
        if (tmp.iov_len < __n) {
          return -0x11;
        }
        memcpy((void *)((long)(max + (long)pvVar2) - __n),(void *)(max + (long)pvVar2),__n);
        max = __n + max;
      }
      info->done = max;
      info_local = (mpt_encode_state *)0x0;
    }
    else {
      off = from->iov_len;
      if (off == 0) {
        info_local = (mpt_encode_state *)0xffffffffffffffff;
      }
      else if (from->iov_base == (void *)0x0) {
        if (max == 0) {
          info_local = (mpt_encode_state *)0xfffffffffffffff0;
        }
        else {
          if (*(char *)((long)pvVar2 + (max - 1)) == '\0') {
            max = max - 1;
          }
          do {
            if (off == 0) {
              info->done = info->done - max;
              return max;
            }
            tmp.iov_base = (void *)max;
            pos = (ssize_t)pvVar2;
            max = mpt_memrchr((iovec *)&pos,1,(int)info->_ctx);
            off = off - 1;
          } while (-1 < (long)max);
          info_local = (mpt_encode_state *)0xfffffffffffffff0;
        }
      }
      else {
        tmp.iov_len = tmp.iov_len - max;
        if (tmp.iov_len == 0) {
          info_local = (mpt_encode_state *)0xffffffffffffffef;
        }
        else {
          pcVar1 = (char *)(max + (long)pvVar2);
          if (off < tmp.iov_len) {
            tmp.iov_len = from->iov_len;
          }
          if (off == 0) {
            pvVar2 = memchr(from->iov_base,(int)info->_ctx,tmp.iov_len);
            if (pvVar2 != (void *)0x0) {
              return -8;
            }
          }
          else if (__n == 0) {
            if ((tmp.iov_len != 0) &&
               (pvVar2 = memchr(from->iov_base,(int)info->_ctx,tmp.iov_len), pvVar2 != (void *)0x0))
            {
              return -8;
            }
          }
          else {
            if (max < off) {
              local_b0 = -max;
            }
            else {
              local_b0 = 1 - off;
            }
            i = (ssize_t)(pcVar1 + (local_b0 - off));
            for (total = local_b0; total < (long)(tmp.iov_len - off); total = total + 1) {
              if (total == 0) {
                i = (ssize_t)from->iov_base;
              }
              if (*(char *)i == *pcVar1) {
                k = total + 1;
                lVar3 = k + off;
                j = (ssize_t)pcVar1;
                c2 = (uint8_t *)i;
                while( true ) {
                  c2 = c2 + 1;
                  j = j + 1;
                  if (lVar3 <= total) break;
                  if (k == 0) {
                    c2 = (uint8_t *)from->iov_base;
                  }
                  if (*c2 != *(uint8_t *)j) break;
                  k = k + 1;
                }
                if (k == lVar3) {
                  return -3;
                }
              }
              i = i + 1;
            }
            memmove(pcVar1 + (tmp.iov_len - __n),pcVar1 + -__n,__n);
          }
          memcpy(pcVar1 + -__n,from->iov_base,tmp.iov_len);
          info->done = tmp.iov_len + max;
          info_local = (mpt_encode_state *)tmp.iov_len;
        }
      }
    }
  }
  return (ssize_t)info_local;
}

Assistant:

extern ssize_t mpt_encode_string(MPT_STRUCT(encode_state) *info, const struct iovec *to, const struct iovec *from)
{
	uint8_t *base;
	size_t sep, len, off, max;
	
	if (!to) {
		info->_ctx = 0;
		info->done = 0;
		info->scratch = 0;
		return 0;
	}
	sep = info->scratch;
	off = info->done + info->scratch;
	
	base = to->iov_base;
	max  = to->iov_len;
	
	if (off > max) {
		return -1;
	}
	/* terminate string */
	if (!from) {
		max -= off;
		
		if (!sep) {
			if (!max) {
				return MPT_ERROR(MissingBuffer);
			}
			base[off++] = info->_ctx;
		}
		else if (max < sep) {
			return MPT_ERROR(MissingBuffer);
		}
		else {
			base += off;
			memcpy(base-sep, base, sep);
			off += sep;
		}
		info->done = off;
		
		/* push delimiter data */
		return 0;
	}
	/* start priority data */
	if (!(len = from->iov_len)) {
		return MPT_ERROR(BadArgument);
	}
	/* delete buffered data */
	if (!from->iov_base) {
		/* no data available */
		if (!off) {
			return MPT_ERROR(MissingData);
		}
		/* no active message, remove endbyte */
		if (!(base)[off-1]) {
			--off;
		}
		while (len--) {
			struct iovec tmp;
			ssize_t pos;
			
			tmp.iov_base = base;
			tmp.iov_len  = off;
			
			/* find message separator */
			if ((pos = mpt_memrchr(&tmp, 1, info->_ctx)) >= 0) {
				off = pos;
				continue;
			}
			return MPT_ERROR(MissingData);
		}
		info->done -= off;
		
		return off;
	}
	if (!(max -= off)) {
		return MPT_ERROR(MissingBuffer);
	}
	base += off;
	if (len < max) {
		max = from->iov_len;
	}
	/* invalid data */
	if (len) {
		if (!sep) {
			if (max && memchr(from->iov_base, info->_ctx, max)) {
				return MPT_ERROR(BadEncoding);
			}
		}
		/* check longer separator pattern */
		else {
			const uint8_t *cmp = base, *val;
			ssize_t i, total;
			
			/* relative compare start position */
			i = (off < len) ? -off : 1 - len;
			
			total = max - len;
			for (val = base - len + i; i < total; ++i, ++val) {
				const uint8_t *v2, *c2;
				ssize_t j, k;
				if (!i) val = from->iov_base;
				if (*val != *cmp) continue;
				v2 = val + 1;
				c2 = cmp + 1;
				for (j = i+1, k = j+len; i < k; ++j) {
					if (!j) v2 = from->iov_base;
					if (*(v2++) != *(c2++)) {
						break;
					}
				}
				if (j == k) {
					return -3;
				}
			}
			/* move delimiter string */
			memmove(base+max-sep, base-sep, sep);
		}
	}
	else if (memchr(from->iov_base, info->_ctx, max)) {
		return MPT_ERROR(BadEncoding);
	}
	/* copy source data */
	memcpy(base-sep, from->iov_base, max);
	off += max;
	
	info->done = off;
	
	return max;
}